

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

int gtStripContig(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  tmsize_t tVar3;
  char *module;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *fmt;
  TIFF *tif;
  uint32_t uVar7;
  ulong uVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  ulong uVar11;
  uint uVar12;
  uint16_t subsamplingver;
  uint local_98;
  uint32_t rowsperstrip;
  uint32_t *local_90;
  uchar *buf;
  uint16_t subsamplinghor;
  ulong local_78;
  TIFF *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  tmsize_t local_48;
  anon_union_8_3_994a2fbf_for_put local_40;
  ulong local_38;
  
  tif = img->tif;
  local_40 = img->put;
  buf = (uchar *)0x0;
  uVar6 = img->width;
  local_60 = 0;
  local_90 = raster;
  TIFFGetFieldDefaulted(tif,0x212,&subsamplinghor,&subsamplingver);
  if (subsamplingver == 0) {
    module = TIFFFileName(tif);
    fmt = "Invalid vertical YCbCr subsampling";
LAB_0025c19a:
    iVar4 = 0;
    TIFFErrorExtR(tif,module,fmt);
  }
  else {
    local_48 = TIFFStripSize(tif);
    local_98 = setorientation(img);
    if ((local_98 & 1) != 0) {
      if ((int)w < 0) {
        module = TIFFFileName(tif);
        fmt = "Width overflow";
        goto LAB_0025c19a;
      }
      local_60 = (ulong)(w * -2);
    }
    uVar8 = 0;
    TIFFGetFieldDefaulted(tif,0x116,&rowsperstrip);
    local_70 = tif;
    local_58 = TIFFScanlineSize(tif);
    local_50 = (ulong)(uVar6 - w);
    if (uVar6 < w) {
      local_50 = uVar8;
    }
    local_78 = (ulong)w;
    local_68 = (ulong)w;
    while( true ) {
      uVar2 = local_58;
      tif = local_70;
      uVar6 = (uint)uVar8;
      if (h < uVar6 || h - uVar6 == 0) break;
      uVar7 = img->row_offset + uVar6;
      uVar5 = uVar7 % rowsperstrip;
      uVar12 = rowsperstrip - uVar5;
      if (h < uVar6 + uVar12) {
        uVar12 = h - uVar6;
      }
      iVar4 = (uint)subsamplingver - uVar12 % (uint)subsamplingver;
      if (uVar12 % (uint)subsamplingver == 0) {
        iVar4 = 0;
      }
      uVar11 = (ulong)(uVar5 + uVar12 + iVar4);
      local_38 = uVar8;
      if ((0 < (long)local_58) &&
         (auVar1._8_8_ = 0, auVar1._0_8_ = local_58,
         SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) < uVar11)) {
        module = TIFFFileName(local_70);
        fmt = "Integer overflow in gtStripContig";
        goto LAB_0025c19a;
      }
      uVar7 = TIFFComputeStrip(local_70,uVar7,0);
      tVar3 = _TIFFReadEncodedStripAndAllocBuffer(tif,uVar7,&buf,local_48,uVar11 * uVar2);
      if ((tVar3 == -1) && ((iVar4 = 0, buf == (uchar *)0x0 || (img->stoponerr != 0))))
      goto LAB_0025c101;
      iVar4 = (int)local_38;
      (*local_40.any)(img);
      uVar8 = (ulong)(uVar12 + iVar4);
    }
    iVar4 = 1;
LAB_0025c101:
    if (1 < local_98) {
      uVar6 = 0;
      for (uVar8 = 0; uVar8 != h; uVar8 = uVar8 + 1) {
        puVar9 = local_90 + local_78 + ((ulong)uVar6 - 1);
        for (puVar10 = local_90 + (uint)((int)uVar8 * (int)local_68); puVar10 < puVar9;
            puVar10 = puVar10 + 1) {
          uVar7 = *puVar10;
          *puVar10 = *puVar9;
          *puVar9 = uVar7;
          puVar9 = puVar9 + -1;
        }
        uVar6 = uVar6 + (int)local_68;
      }
    }
    _TIFFfreeExt(img->tif,buf);
  }
  return iVar4;
}

Assistant:

static int gtStripContig(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                         uint32_t h)
{
    TIFF *tif = img->tif;
    tileContigRoutine put = img->put.contig;
    uint32_t row, y, nrow, nrowsub, rowstoread;
    tmsize_t pos;
    unsigned char *buf = NULL;
    uint32_t rowsperstrip;
    uint16_t subsamplinghor, subsamplingver;
    uint32_t imagewidth = img->width;
    tmsize_t scanline;
    int32_t fromskew, toskew;
    int ret = 1, flip;
    tmsize_t maxstripsize;

    TIFFGetFieldDefaulted(tif, TIFFTAG_YCBCRSUBSAMPLING, &subsamplinghor,
                          &subsamplingver);
    if (subsamplingver == 0)
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Invalid vertical YCbCr subsampling");
        return (0);
    }

    maxstripsize = TIFFStripSize(tif);

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if (w > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "Width overflow");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(w + w);
    }
    else
    {
        y = 0;
        toskew = -(int32_t)(w - w);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_ROWSPERSTRIP, &rowsperstrip);

    scanline = TIFFScanlineSize(tif);
    fromskew = (w < imagewidth ? imagewidth - w : 0);
    for (row = 0; row < h; row += nrow)
    {
        uint32_t temp;
        rowstoread = rowsperstrip - (row + img->row_offset) % rowsperstrip;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        nrowsub = nrow;
        if ((nrowsub % subsamplingver) != 0)
            nrowsub += subsamplingver - nrowsub % subsamplingver;
        temp = (row + img->row_offset) % rowsperstrip + nrowsub;
        if (scanline > 0 && temp > (size_t)(TIFF_TMSIZE_T_MAX / scanline))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif),
                          "Integer overflow in gtStripContig");
            return 0;
        }
        if (_TIFFReadEncodedStripAndAllocBuffer(
                tif, TIFFComputeStrip(tif, row + img->row_offset, 0),
                (void **)(&buf), maxstripsize,
                temp * scanline) == (tmsize_t)(-1) &&
            (buf == NULL || img->stoponerr))
        {
            ret = 0;
            break;
        }

        pos = ((row + img->row_offset) % rowsperstrip) * scanline +
              ((tmsize_t)img->col_offset * img->samplesperpixel);
        tmsize_t roffset = (tmsize_t)y * w;
        (*put)(img, raster + roffset, 0, y, w, nrow, fromskew, toskew,
               buf + pos);
        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}